

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O0

void embree::initializeClothPositions(ClothModel *cloth)

{
  __normal_iterator<embree::Vec3fa_*,_std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>_>
  __last;
  __normal_iterator<embree::Vec3fa_*,_std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>_>
  __first;
  reference pvVar1;
  long in_RDI;
  vec_t nullvec;
  size_t j;
  size_t i;
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float local_a8;
  ClothModel *in_stack_ffffffffffffff60;
  float local_8c;
  float local_7c;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 *local_30;
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *in_stack_ffffffffffffffd8;
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *in_stack_ffffffffffffffe0;
  
  local_48 = in_RDI;
  std::
  vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::clear((vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
           *)0x140b7b);
  local_a8 = in_stack_ffffffffffffff44;
  for (local_50 = 0; local_50 < NX; local_50 = local_50 + 1) {
    for (local_58 = 0; local_58 < NZ; local_58 = local_58 + 1) {
      local_7c = (float)local_50;
      in_stack_ffffffffffffff60 = (ClothModel *)&NX;
      local_8c = (float)(NX - 1);
      in_stack_ffffffffffffff50 = local_7c * (5.0 / local_8c) + -2.5;
      pvVar1 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                         ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)
                          (local_48 + 0x38),NX * local_50 + local_58);
      (pvVar1->field_0).m128[0] = in_stack_ffffffffffffff50;
      pvVar1 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                         ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)
                          (local_48 + 0x38),
                          (long)(in_stack_ffffffffffffff60->super_Mesh)._vptr_Mesh * local_50 +
                          local_58);
      (pvVar1->field_0).m128[1] = 1.5;
      in_stack_ffffffffffffff54 = (float)(long)local_58;
      local_a8 = (float)local_58;
      in_stack_ffffffffffffff48 = (float)(long)(NZ - 1);
      in_stack_ffffffffffffff4c = (float)(NZ - 1);
      in_stack_ffffffffffffff40 = local_a8 * (5.0 / in_stack_ffffffffffffff4c) + -2.5;
      pvVar1 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                         ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)
                          (local_48 + 0x38),NX * local_50 + local_58);
      (pvVar1->field_0).m128[2] = in_stack_ffffffffffffff40;
    }
  }
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  local_30 = &local_68;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_68 = 0;
  uStack_60 = 0;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::begin(in_stack_ffffffffffffff38);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::end(in_stack_ffffffffffffff38);
  __first._M_current._4_4_ = in_stack_ffffffffffffff54;
  __first._M_current._0_4_ = in_stack_ffffffffffffff50;
  __last._M_current._4_4_ = in_stack_ffffffffffffff4c;
  __last._M_current._0_4_ = in_stack_ffffffffffffff48;
  std::
  fill<__gnu_cxx::__normal_iterator<embree::Vec3fa*,std::vector<embree::Vec3fa,std::allocator<embree::Vec3fa>>>,embree::Vec3fa>
            (__first,__last,(Vec3fa *)CONCAT44(local_a8,in_stack_ffffffffffffff40));
  cur_time = 0;
  collide2::ClothModel::clearCollisionConstraints(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void initializeClothPositions (collide2::ClothModel & cloth) {

  sim_collisions.clear();

  for (size_t i=0; i<NX; ++i) {
    for (size_t j=0; j<NZ; ++j) {
      cloth.x_0_[NX*i+j].x = -(.5f*width) + (float)i*(width/(float)(NX-1));
      cloth.x_0_[NX*i+j].y = +1.5f;
      cloth.x_0_[NX*i+j].z = -(.5f*height) + (float)j*(height/(float)(NZ-1));
    }
  }
  cloth.x_ = cloth.x_0_;
  cloth.x_old_ = cloth.x_0_;
  cloth.x_last_ = cloth.x_0_;
  collide2::vec_t nullvec(0.f, 0.f, 0.f);
  std::fill (cloth.v_.begin (), cloth.v_.end (), nullvec);

  cur_time = 0;
  cloth.clearCollisionConstraints();
}